

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Dumper::dumpString(Dumper *this,char *src,ValueLength len)

{
  byte bVar1;
  _func_int **pp_Var2;
  Exception *this_00;
  undefined8 uVar3;
  byte *pbVar4;
  ushort value;
  ulong uVar5;
  Sink *pSVar6;
  byte *pbVar7;
  int iVar8;
  byte bVar9;
  
  (*this->_sink->_vptr_Sink[4])(this->_sink,len);
  if (0 < (long)len) {
    pbVar4 = (byte *)(src + len);
    do {
      bVar1 = *src;
      pbVar7 = (byte *)src;
      if ((long)(char)bVar1 < 0) {
        if ((bVar1 & 0xe0) == 0xc0) {
          pbVar7 = (byte *)src + 1;
          if (pbVar4 <= pbVar7) {
LAB_0010983a:
            this_00 = (Exception *)__cxa_allocate_exception(0x18);
            Exception::Exception(this_00,InvalidUtf8Sequence);
            __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
          }
          if (this->options->escapeUnicode == true) {
            value = *pbVar7 & 0x3f | (bVar1 & 0x1f) << 6;
LAB_00109744:
            dumpUnicodeCharacter(this,value);
            goto LAB_0010981f;
          }
          pSVar6 = this->_sink;
          pp_Var2 = pSVar6->_vptr_Sink;
          uVar3 = 2;
        }
        else if ((bVar1 & 0xf0) == 0xe0) {
          pbVar7 = (byte *)src + 2;
          if (pbVar4 <= pbVar7) goto LAB_0010983a;
          if (this->options->escapeUnicode == true) {
            value = ((byte *)src)[2] & 0x3f | (((byte *)src)[1] & 0x3f) << 6 | (ushort)bVar1 << 0xc;
            goto LAB_00109744;
          }
          pSVar6 = this->_sink;
          pp_Var2 = pSVar6->_vptr_Sink;
          uVar3 = 3;
        }
        else {
          if ((bVar1 & 0xf8) != 0xf0) goto LAB_0010981f;
          pbVar7 = (byte *)src + 3;
          if (pbVar4 <= pbVar7) goto LAB_0010983a;
          if (this->options->escapeUnicode == true) {
            iVar8 = (((byte *)src)[2] & 0x3f) * 0x40;
            bVar9 = ((byte *)src)[3];
            dumpUnicodeCharacter
                      (this,(ushort)(((((byte *)src)[1] & 0x3f) << 0xc | (uint)bVar1 << 0x12) +
                                     iVar8 + 0xf0000 >> 10) & 0x3ff | 0xd800);
            value = bVar9 & 0x3f | (ushort)iVar8 | 0xdc00;
            goto LAB_00109744;
          }
          pSVar6 = this->_sink;
          pp_Var2 = pSVar6->_vptr_Sink;
          uVar3 = 4;
        }
        (*pp_Var2[3])(pSVar6,src,uVar3);
      }
      else {
        bVar9 = "uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[(char)bVar1];
        if (bVar9 == 0) {
          (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(uint)(int)(char)bVar1);
        }
        else {
          if (this->options->escapeControl == true) {
            if ((bVar1 != 0x2f) || (this->options->escapeForwardSlashes == true)) {
              (*this->_sink->_vptr_Sink[2])(this->_sink,0x5c);
            }
            (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(uint)(int)(char)bVar9);
            if (bVar9 != 0x75) goto LAB_0010981f;
            bVar9 = bVar1 & 0xf;
            (*this->_sink->_vptr_Sink[3])(this->_sink,"00",2);
            (*this->_sink->_vptr_Sink[2])(this->_sink,(ulong)(byte)(bVar1 >> 4 | 0x30));
            pSVar6 = this->_sink;
            bVar1 = bVar9 + 0x37;
            if (bVar9 < 10) {
              bVar1 = bVar9 + 0x30;
            }
            pp_Var2 = pSVar6->_vptr_Sink;
            uVar5 = (ulong)bVar1;
          }
          else if ((bVar9 - 0x22 < 0x3b) &&
                  ((0x400000000002001U >> ((ulong)(bVar9 - 0x22) & 0x3f) & 1) != 0)) {
            (*this->_sink->_vptr_Sink[2])(this->_sink,0x5c);
            pSVar6 = this->_sink;
            pp_Var2 = pSVar6->_vptr_Sink;
            uVar5 = (ulong)(uint)(int)(char)bVar9;
          }
          else {
            pSVar6 = this->_sink;
            pp_Var2 = pSVar6->_vptr_Sink;
            uVar5 = 0x20;
          }
          (*pp_Var2[2])(pSVar6,uVar5);
        }
      }
LAB_0010981f:
      src = (char *)(pbVar7 + 1);
    } while (src < pbVar4);
  }
  return;
}

Assistant:

void Dumper::dumpString(char const* src, ValueLength len) {
  static char const EscapeTable[256] = {
      // 0    1    2    3    4    5    6    7    8    9    A    B    C    D    E
      // F
      'u',  'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r',
      'u',
      'u',  // 00
      'u',  'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u',
      'u',
      'u',  // 10
      0,    0,   '"', 0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,
      '/',  // 20
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,
      0,  // 30~4F
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      '\\', 0,   0,   0,  // 50
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,
      0,  // 60~FF
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0};

  _sink->reserve(len);

  uint8_t const* p = reinterpret_cast<uint8_t const*>(src);
  uint8_t const* e = p + len;
  while (p < e) {
    uint8_t c = *p;

    if ((c & 0x80U) == 0) {
      // check for control characters
      char esc = EscapeTable[c];

      if (esc) {
        if (options->escapeControl) {
          if (c != '/' || options->escapeForwardSlashes) {
            // escape forward slashes only when requested
            _sink->push_back('\\');
          }
          _sink->push_back(static_cast<char>(esc));
          if (esc == 'u') {
            uint16_t i1 = (((uint16_t)c) & 0xf0U) >> 4;
            uint16_t i2 = (((uint16_t)c) & 0x0fU);

            _sink->append("00", 2);
            _sink->push_back(
                static_cast<char>((i1 < 10) ? ('0' + i1) : ('A' + i1 - 10)));
            _sink->push_back(
                static_cast<char>((i2 < 10) ? ('0' + i2) : ('A' + i2 - 10)));
          }
        } else {
          if (esc == '"' || esc == '/' || esc == '\\') {
            _sink->push_back('\\');
            _sink->push_back(static_cast<char>(esc));
          } else {
            _sink->push_back(' ');
          }
        }
      } else {
        _sink->push_back(static_cast<char>(c));
      }
    } else if ((c & 0xe0U) == 0xc0U) {
      // two-byte sequence
      if (p + 1 >= e) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }

      if (options->escapeUnicode) {
        uint16_t value =
            ((((uint16_t)*p & 0x1fU) << 6) | ((uint16_t) * (p + 1) & 0x3fU));
        dumpUnicodeCharacter(value);
      } else {
        _sink->append(reinterpret_cast<char const*>(p), 2);
      }
      ++p;
    } else if ((c & 0xf0U) == 0xe0U) {
      // three-byte sequence
      if (p + 2 >= e) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }

      if (options->escapeUnicode) {
        uint16_t value = ((((uint16_t)*p & 0x0fU) << 12) |
                          (((uint16_t) * (p + 1) & 0x3fU) << 6) |
                          ((uint16_t) * (p + 2) & 0x3fU));
        dumpUnicodeCharacter(value);
      } else {
        _sink->append(reinterpret_cast<char const*>(p), 3);
      }
      p += 2;
    } else if ((c & 0xf8U) == 0xf0U) {
      // four-byte sequence
      if (p + 3 >= e) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }

      if (options->escapeUnicode) {
        uint32_t value = ((((uint32_t)*p & 0x0fU) << 18) |
                          (((uint32_t) * (p + 1) & 0x3fU) << 12) |
                          (((uint32_t) * (p + 2) & 0x3fU) << 6) |
                          ((uint32_t) * (p + 3) & 0x3fU));
        // construct the surrogate pairs
        value -= 0x10000U;
        uint16_t high = (uint16_t)(((value & 0xffc00U) >> 10) + 0xd800);
        dumpUnicodeCharacter(high);
        uint16_t low = (value & 0x3ffU) + 0xdc00U;
        dumpUnicodeCharacter(low);
      } else {
        _sink->append(reinterpret_cast<char const*>(p), 4);
      }
      p += 3;
    }

    ++p;
  }
}